

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_server_state_e handle_server_set_not_working(pcp_server_t *s)

{
  pcp_server_t *local_20;
  flow_iterator_data d;
  pcp_server_t *s_local;
  
  d.s._0_4_ = 4;
  local_20 = s;
  d._8_8_ = s;
  pcp_logger(PCP_LOGLVL_WARN,
             "PCP server %s failed to respond. Disabling sending of PCP messages to this server for %d minutes."
             ,s->pcp_server_paddr,0x3c);
  pcp_db_foreach_flow(*(pcp_ctx_t **)d._8_8_,flow_send_event_iter,&local_20);
  gettimeofday((timeval *)(d._8_8_ + 0x128),(__timezone_ptr_t)0x0);
  *(long *)(d._8_8_ + 0x128) = *(long *)(d._8_8_ + 0x128) + 0xe10;
  return pss_not_working;
}

Assistant:

static pcp_server_state_e handle_server_set_not_working(pcp_server_t *s) {
    struct flow_iterator_data d = {s, fev_failed};

    PCP_LOG(PCP_LOGLVL_DEBUG, "Entered function %s", __FUNCTION__);
    PCP_LOG(PCP_LOGLVL_WARN,
            "PCP server %s failed to respond. "
            "Disabling sending of PCP messages to this server for %d minutes.",
            s->pcp_server_paddr, PCP_SERVER_DISCOVERY_RETRY_DELAY / 60);

    pcp_db_foreach_flow(s->ctx, flow_send_event_iter, &d);

    gettimeofday(&s->next_timeout, NULL);
    s->next_timeout.tv_sec += PCP_SERVER_DISCOVERY_RETRY_DELAY;

    return pss_not_working;
}